

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,StringView s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  allocator<char> local_79;
  string local_78 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_38;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *local_20;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this_local;
  StringView s_local;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *)s._M_len;
  local_20 = this;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::MatcherBase
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>);
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00197578;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_78,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_79);
  Eq<std::__cxx11::string>(&local_58,(testing *)local_78,x);
  Matcher<std::basic_string_view<char,std::char_traits<char>>>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>> *)&local_38,&local_58);
  operator=(this,&local_38);
  ~Matcher(&local_38);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher(&local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(internal::StringView s) {
  *this = Eq(std::string(s));
}